

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_reaction_diffusion_mri.c
# Opt level: O3

int fs(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  lVar2 = *user_data;
  dVar1 = *(double *)((long)user_data + 0x10);
  dVar7 = *(double *)((long)user_data + 8);
  pdVar3 = (double *)N_VGetArrayPointer();
  if (pdVar3 == (double *)0x0) {
    fs_cold_2();
  }
  else {
    pdVar4 = (double *)N_VGetArrayPointer(ydot);
    if (pdVar4 != (double *)0x0) {
      dVar6 = ((dVar1 + dVar1) / dVar7) / dVar7;
      *pdVar4 = (pdVar3[1] - *pdVar3) * dVar6;
      if (2 < lVar2) {
        dVar7 = (dVar1 / dVar7) / dVar7;
        lVar5 = 0;
        do {
          pdVar4[lVar5 + 1] =
               pdVar3[lVar5 + 2] * dVar7 + pdVar3[lVar5] * dVar7 + pdVar3[lVar5 + 1] * -dVar6;
          lVar5 = lVar5 + 1;
        } while (lVar2 + -2 != lVar5);
      }
      pdVar4[lVar2 + -1] = dVar6 * (pdVar3[lVar2 + -2] - pdVar3[lVar2 + -1]);
      return 0;
    }
    fs_cold_1();
  }
  return 1;
}

Assistant:

static int fs(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata = (UserData)user_data; /* access problem data */
  sunindextype N = udata->N;            /* set variable shortcuts */
  sunrealtype k  = udata->k;
  sunrealtype dx = udata->dx;
  sunrealtype *Y = NULL, *Ydot = NULL;
  sunrealtype c1, c2;
  sunindextype i;

  /* access state array data */
  Y = N_VGetArrayPointer(y);
  if (check_retval((void*)Y, "N_VGetArrayPointer", 0)) { return 1; }

  /* access RHS array data */
  Ydot = N_VGetArrayPointer(ydot);
  if (check_retval((void*)Ydot, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate over domain, computing diffusion term */
  c1 = k / dx / dx;
  c2 = SUN_RCONST(2.0) * k / dx / dx;

  /* left boundary condition */
  Ydot[0] = c2 * (Y[1] - Y[0]);

  /* interior points */
  for (i = 1; i < N - 1; i++)
  {
    Ydot[i] = c1 * Y[i - 1] - c2 * Y[i] + c1 * Y[i + 1];
  }

  /* right boundary condition */
  Ydot[N - 1] = c2 * (Y[N - 2] - Y[N - 1]);

  /* Return with success */
  return 0;
}